

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::utf8_3bytes(sequence *__return_storage_ptr__,spec *param_1)

{
  sequence sStack_148;
  sequence local_128;
  sequence local_108;
  sequence local_e8;
  either local_c8;
  character_in_range local_a8;
  character_in_range local_98;
  character_in_range local_88;
  character_in_range local_78;
  character local_68;
  character_in_range local_58;
  character_in_range local_48;
  character_in_range local_38;
  character local_28;
  
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499940;
  local_28.value_ = 0xe0;
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_38.from_ = 0xa0;
  local_38.to_ = 0xbf;
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&local_e8,&local_28,&local_38);
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_48.from_ = 0xe1;
  local_48.to_ = 0xec;
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_58.from_ = 0x80;
  local_58.to_ = 0xbf;
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_108,&local_48,&local_58);
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499940;
  local_68.value_ = 0xed;
  local_78.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_78.from_ = 0x80;
  local_78.to_ = 0x9f;
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&local_128,&local_68,&local_78);
  local_88.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_88.from_ = 0xee;
  local_88.to_ = 0xef;
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_98.from_ = 0x80;
  local_98.to_ = 0xbf;
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (&sStack_148,&local_88,&local_98);
  either::
  either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (&local_c8,&local_e8,&local_108,&local_128,&sStack_148);
  local_a8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a00;
  local_a8.from_ = 0x80;
  local_a8.to_ = 0xbf;
  sequence::sequence<toml::detail::either,toml::detail::character_in_range>
            (__return_storage_ptr__,&local_c8,&local_a8);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_c8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&sStack_148.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_128.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_108.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_e8.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence utf8_3bytes(const spec&)
{
    return sequence(/*1~2 bytes = */either(
        sequence(character         (0xE0),       character_in_range(0xA0, 0xBF)),
        sequence(character_in_range(0xE1, 0xEC), character_in_range(0x80, 0xBF)),
        sequence(character         (0xED),       character_in_range(0x80, 0x9F)),
        sequence(character_in_range(0xEE, 0xEF), character_in_range(0x80, 0xBF))
    ), /*3rd byte = */ character_in_range(0x80, 0xBF));
}